

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort.cpp
# Opt level: O2

void burstsort_vector(uchar **strings,size_t n)

{
  TrieNode<unsigned_char> *this;
  _func_void_uchar_ptr_ptr_int_int *in_RCX;
  
  this = (TrieNode<unsigned_char> *)operator_new(0x820);
  TrieNode<unsigned_char>::TrieNode(this);
  insert<8000u,std::vector<unsigned_char*,std::allocator<unsigned_char*>>,BurstSimple<unsigned_char>,unsigned_char>
            (this,strings,n);
  traverse<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,void(*)(unsigned_char**,int,int),unsigned_char>
            (this,strings,0,in_RCX);
  return;
}

Assistant:

void burstsort_vector(unsigned char** strings, size_t n)
{
	typedef unsigned char CharT;
	typedef std::vector<unsigned char*> BucketT;
	typedef BurstSimple<CharT> BurstImpl;
	//typedef BurstRecursive<CharT> BurstImpl;
	TrieNode<CharT>* root = new TrieNode<CharT>;
	insert<8000, BucketT, BurstImpl>(root, strings, n);
	traverse<BucketT>(root, strings, 0, SmallSort);
}